

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::checkTimeStep(PeleLM *this,Real a_time,Real a_dt)

{
  int iVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  Real RVar8;
  Real RVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  double *pdVar14;
  Long LVar15;
  Long LVar16;
  Long LVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  Long LVar21;
  Long LVar22;
  int iVar23;
  int iVar24;
  double *pdVar25;
  Long LVar26;
  Long LVar27;
  int iVar28;
  int iVar29;
  double *pdVar30;
  Long LVar31;
  Long LVar32;
  double *pdVar33;
  Long LVar34;
  Long LVar35;
  int iVar36;
  double *pdVar37;
  Long LVar38;
  Long LVar39;
  double *pdVar40;
  Long LVar41;
  Long LVar42;
  int iVar43;
  int iVar44;
  uint uVar45;
  uint uVar46;
  int iVar47;
  uint uVar48;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  long lVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  long lVar69;
  long lVar70;
  long lVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  char *__format;
  int iVar75;
  int iVar76;
  long lVar77;
  uint uVar78;
  long lVar79;
  int iVar80;
  uint uVar81;
  int iVar82;
  uint uVar83;
  double dVar84;
  double dVar85;
  MFIter mfi;
  ulong local_578;
  Box local_26c;
  Array4<const_double> local_250;
  Array4<const_double> local_210;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  if ((NavierStokesBase::fixed_dt <= 0.0) && (divu_ceiling != 0)) {
    this_00 = &amrex::AmrLevel::get_data((AmrLevel *)this,NavierStokesBase::Divu_Type,a_time)->
               super_FabArray<amrex::FArrayBox>;
    this_01 = &amrex::AmrLevel::get_data((AmrLevel *)this,0,a_time)->
               super_FabArray<amrex::FArrayBox>;
    amrex::MFIter::MFIter(&local_90,&this_01->super_FabArrayBase,true);
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        amrex::MFIter::tilebox(&local_26c,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_d0,
                   &(this->super_NavierStokesBase).rho_ctime.super_FabArray<amrex::FArrayBox>,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_250,this_01,&local_90,0);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,this_00,&local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_150,
                   &(this->super_NavierStokesBase).volume.super_FabArray<amrex::FArrayBox>,&local_90
                  );
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_190,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x540,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_1d0,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x6c0,
                   &local_90);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_210,
                   (FabArray<amrex::FArrayBox> *)&(this->super_NavierStokesBase).field_0x840,
                   &local_90);
        iVar44 = local_d0.begin.z;
        iVar43 = local_d0.begin.y;
        LVar42 = local_d0.kstride;
        LVar41 = local_d0.jstride;
        pdVar40 = local_d0.p;
        LVar39 = local_110.kstride;
        LVar38 = local_110.jstride;
        pdVar37 = local_110.p;
        iVar36 = local_150.begin.x;
        LVar35 = local_150.kstride;
        LVar34 = local_150.jstride;
        pdVar33 = local_150.p;
        LVar32 = local_190.kstride;
        LVar31 = local_190.jstride;
        pdVar30 = local_190.p;
        iVar29 = local_1d0.begin.y;
        iVar28 = local_1d0.begin.x;
        LVar27 = local_1d0.kstride;
        LVar26 = local_1d0.jstride;
        pdVar25 = local_1d0.p;
        iVar24 = local_210.begin.z;
        iVar23 = local_210.begin.x;
        LVar22 = local_210.kstride;
        LVar21 = local_210.jstride;
        pdVar20 = local_210.p;
        iVar19 = local_250.begin.z;
        iVar18 = local_250.begin.y;
        LVar17 = local_250.nstride;
        LVar16 = local_250.kstride;
        LVar15 = local_250.jstride;
        pdVar14 = local_250.p;
        iVar13 = local_26c.bigend.vect[1];
        iVar12 = local_26c.bigend.vect[0];
        iVar11 = local_26c.smallend.vect[1];
        iVar10 = local_26c.smallend.vect[0];
        RVar9 = min_rho_divu_ceiling;
        RVar8 = divu_dt_factor;
        iVar7 = divu_ceiling;
        if (local_26c.smallend.vect[2] <= local_26c.bigend.vect[2]) {
          dVar3 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[0];
          dVar4 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[1];
          dVar5 = (this->super_NavierStokesBase).super_AmrLevel.geom.super_CoordSys.inv_dx[2];
          uVar54 = local_26c.bigend.vect[2] + 1;
          uVar81 = ~local_d0.begin.x;
          uVar45 = ~local_d0.begin.y;
          uVar46 = ~local_d0.begin.z;
          iVar75 = -local_110.begin.x;
          iVar47 = -local_250.begin.x;
          iVar76 = -local_190.begin.x;
          iVar80 = -local_d0.begin.x;
          uVar74 = ~local_250.begin.x;
          lVar61 = (long)local_110.begin.y;
          lVar62 = (long)local_110.begin.z;
          lVar63 = (long)local_150.begin.y;
          lVar64 = (long)local_150.begin.z;
          lVar65 = (long)local_190.begin.y;
          lVar66 = (long)local_190.begin.z;
          lVar67 = (long)local_1d0.begin.z;
          lVar68 = (long)local_210.begin.y;
          uVar78 = local_26c.bigend.vect[1] + 1;
          uVar48 = local_26c.bigend.vect[0] + 1;
          uVar73 = local_26c.smallend.vect[2];
          do {
            local_578 = (ulong)uVar73;
            if (iVar11 <= iVar13) {
              iVar82 = uVar73 + 1;
              lVar79 = (int)(uVar73 - iVar44) * LVar42;
              lVar77 = (int)(uVar73 - iVar19) * LVar16;
              lVar49 = (iVar82 - iVar44) * LVar42;
              lVar55 = (long)(int)uVar73;
              lVar50 = (lVar55 - lVar66) * LVar32;
              lVar69 = (lVar55 - lVar67) * LVar27;
              lVar56 = (lVar55 - lVar62) * LVar39;
              uVar83 = iVar11;
              do {
                if (iVar10 <= iVar12) {
                  iVar1 = uVar83 + 1;
                  lVar51 = (int)(uVar83 - iVar43) * LVar41;
                  lVar52 = (int)(uVar83 - iVar18) * LVar15;
                  lVar57 = (iVar1 - iVar43) * LVar41;
                  lVar58 = (long)(int)uVar83;
                  lVar70 = (lVar58 - lVar65) * LVar31;
                  lVar71 = (lVar58 - lVar68) * LVar21;
                  lVar59 = (lVar58 - lVar61) * LVar38;
                  uVar72 = iVar10;
                  do {
                    lVar60 = (long)(int)(iVar80 + uVar72);
                    dVar6 = pdVar40[lVar51 + lVar60 + lVar79];
                    if (iVar7 == 3) {
                      lVar53 = (long)(int)(iVar47 + uVar72);
                      pdVar2 = pdVar14 + lVar52 + lVar53 + lVar77;
                      dVar85 = (((pdVar2[LVar17 * 2] +
                                 pdVar14[lVar52 + lVar53 + (iVar82 - iVar19) * LVar16 + LVar17 * 2])
                                 * (pdVar40[lVar51 + lVar60 + lVar49] + dVar6) * 0.25 *
                                 pdVar20[lVar71 + (long)(int)(uVar72 - iVar23) +
                                                  (iVar82 - iVar24) * LVar22] +
                                (((pdVar2[LVar17] +
                                  pdVar14[LVar17 + lVar77 + (iVar1 - iVar18) * LVar15 + lVar53]) *
                                  (pdVar40[lVar79 + lVar57 + lVar60] + dVar6) * 0.25 *
                                  pdVar25[lVar69 + (iVar1 - iVar29) * LVar26 +
                                                   (long)(int)(uVar72 - iVar28)] +
                                 ((*pdVar2 + pdVar14[lVar52 + lVar77 + (int)(iVar47 + 1 + uVar72)])
                                  * (pdVar40[lVar51 + lVar79 + (int)(iVar80 + 1 + uVar72)] + dVar6)
                                  * 0.25 * pdVar30[lVar50 + lVar70 + (int)(iVar76 + 1 + uVar72)] -
                                 (pdVar14[lVar52 + lVar77 + (int)(uVar74 + uVar72)] + *pdVar2) *
                                 (pdVar40[lVar51 + lVar79 + (int)(uVar81 + uVar72)] + dVar6) * 0.25
                                 * pdVar30[lVar50 + lVar70 + (int)(iVar76 + uVar72)])) -
                                (pdVar14[LVar17 + lVar77 + (int)((uVar83 - 1) - iVar18) * LVar15 +
                                                           lVar53] + pdVar2[LVar17]) *
                                (pdVar40[lVar79 + (int)((uVar83 - 1) - iVar43) * LVar41 + lVar60] +
                                dVar6) * 0.25 *
                                pdVar25[lVar69 + (int)(uVar83 - iVar29) * LVar26 +
                                                 (long)(int)(uVar72 - iVar28)])) -
                               (pdVar14[lVar52 + lVar53 + (int)((uVar73 - 1) - iVar19) * LVar16 +
                                                          LVar17 * 2] + pdVar2[LVar17 * 2]) *
                               (pdVar40[lVar51 + lVar60 + (int)((uVar73 - 1) - iVar44) * LVar42] +
                               dVar6) * 0.25 *
                               pdVar20[lVar71 + (long)(int)(uVar72 - iVar23) +
                                                (int)(uVar73 - iVar24) * LVar22]) /
                               pdVar33[(lVar55 - lVar64) * LVar35 +
                                       (lVar58 - lVar63) * LVar34 + (long)(int)(uVar72 - iVar36)];
LAB_0018ebb4:
                      dVar84 = 1000000000000.0;
                      if (0.0 < dVar85) {
                        dVar84 = (double)(~-(ulong)(RVar9 < dVar6) & (ulong)ABS(dVar6) |
                                         (ulong)(dVar6 - RVar9) & -(ulong)(RVar9 < dVar6));
LAB_0018ebf1:
                        dVar84 = dVar84 / dVar85;
                      }
                    }
                    else {
                      if (iVar7 == 2) {
                        lVar53 = (long)(int)(iVar47 + uVar72);
                        dVar85 = (pdVar40[lVar51 + lVar60 + lVar49] -
                                 pdVar40[lVar51 + lVar60 + (int)(uVar46 + uVar73) * LVar42]) *
                                 pdVar14[lVar77 + lVar52 + lVar53 + LVar17 * 2] * dVar5 +
                                 (pdVar40[lVar79 + lVar57 + lVar60] -
                                 pdVar40[lVar79 + (int)(uVar45 + uVar83) * LVar41 + lVar60]) *
                                 pdVar14[lVar77 + lVar52 + lVar53 + LVar17] * dVar4 +
                                 pdVar37[lVar56 + lVar59 + (int)(iVar75 + uVar72)] * dVar6 +
                                 (pdVar40[lVar51 + lVar79 + (int)(iVar80 + uVar72 + 1)] -
                                 pdVar40[lVar51 + lVar79 + (int)(uVar81 + uVar72)]) *
                                 pdVar14[lVar77 + lVar52 + lVar53] * dVar3;
                        goto LAB_0018ebb4;
                      }
                      dVar84 = 1000000000000.0;
                      if (iVar7 == 1) {
                        dVar85 = pdVar37[lVar56 + lVar59 + (int)(iVar75 + uVar72)];
                        dVar84 = 1000000000000.0;
                        if (dVar85 <= 0.0) goto LAB_0018ebf5;
                        if (dVar6 <= RVar9) {
                          dVar84 = 1.0;
                        }
                        else {
                          dVar84 = 1.0 - RVar9 / dVar6;
                        }
                        goto LAB_0018ebf1;
                      }
                    }
LAB_0018ebf5:
                    if (a_dt <= dVar84) {
                      if (dVar84 * RVar8 < a_dt) {
                        __format = 
                        " WARNING: check_divu_dt - [%i,%i,%i] dtcell*dtfactor %f8.6 > dt %f8.6";
                        goto LAB_0018ec1a;
                      }
                    }
                    else {
                      __format = " ERROR: check_divu_dt - [%i,%i,%i] dtcell %f8.6 > dt %f8.6";
LAB_0018ec1a:
                      printf(__format,(ulong)uVar72,(ulong)uVar83,local_578);
                    }
                    uVar72 = uVar72 + 1;
                  } while (uVar48 != uVar72);
                }
                uVar83 = uVar83 + 1;
              } while (uVar83 != uVar78);
            }
            uVar73 = uVar73 + 1;
          } while (uVar73 != uVar54);
        }
        amrex::MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    amrex::MFIter::~MFIter(&local_90);
  }
  return;
}

Assistant:

void
PeleLM::checkTimeStep (const Real a_time,
                       Real a_dt)
{
   BL_PROFILE("PLM::checkTimeStep()");

   if (fixed_dt > 0.0 || !divu_ceiling) {
      return;
   }

   // Get class state data refs. We assume it's been FillPatched already !
   const MultiFab& divU = get_data(Divu_Type,a_time);
   const MultiFab& S    = get_data(State_Type,a_time);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
   for (MFIter mfi(S,TilingIfNotGPU()); mfi.isValid();++mfi)
   {
      const Box&  bx   = mfi.tilebox();
      auto const& rho  = rho_ctime.const_array(mfi);
      auto const& vel  = S.const_array(mfi,0);
      auto const& divu = divU.const_array(mfi);
      auto const& vol  = volume.const_array(mfi);
      AMREX_D_TERM(auto const& areax = (area[0]).const_array(mfi);,
                   auto const& areay = (area[1]).const_array(mfi);,
                   auto const& areaz = (area[2]).const_array(mfi););
      int  divu_check_flag = divu_ceiling;
      Real divu_dt_fac     = divu_dt_factor;
      Real rho_min         = min_rho_divu_ceiling;
      const auto dxinv     = geom.InvCellSizeArray();

      amrex::ParallelFor(bx, [rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz),
                              divu_check_flag, divu_dt_fac, rho_min, dxinv, a_dt]
      AMREX_GPU_DEVICE (int i, int j, int k) noexcept
      {
         check_divu_dt(i, j, k, divu_check_flag, divu_dt_fac, rho_min, dxinv,
                       rho, vel, divu, vol, AMREX_D_DECL(areax,areay,areaz), a_dt);
      });
   }
}